

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O2

bool __thiscall
unodb::
mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::remove_internal(mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *this,art_key_type k)

{
  bool bVar1;
  
  std::mutex::lock(&this->mutex);
  bVar1 = db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::remove_internal(&this->db_,(art_key_type)k.field_0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return bVar1;
}

Assistant:

[[nodiscard]] auto remove_internal(art_key_type k) {
    const std::lock_guard guard{mutex};
    return db_.remove_internal(k);
  }